

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O2

Token trieste::detail::find_token(string_view str)

{
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
  *this;
  iterator iVar1;
  undefined1 *puVar2;
  key_type local_20;
  
  this = &token_map()->_M_t;
  iVar1 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
          ::find(this,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_M_impl).super__Rb_tree_header) {
    puVar2 = Invalid;
  }
  else {
    puVar2 = (undefined1 *)iVar1._M_node[1]._M_left;
  }
  return (Token)puVar2;
}

Assistant:

inline Token find_token(std::string_view str)
    {
      auto& map = token_map();
      auto it = map.find(str);

      if (it != map.end())
        return it->second;

      return Invalid;
    }